

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructuresOperators.cpp
# Opt level: O3

ostream * operator<<(ostream *outs,Triangle *triangle)

{
  std::__ostream_insert<char,std::char_traits<char>>(outs,"x: ",3);
  operator<<(outs,&triangle->x);
  std::__ostream_insert<char,std::char_traits<char>>(outs," (",2);
  operator<<(outs,triangle->colorX);
  std::__ostream_insert<char,std::char_traits<char>>(outs,") y: ",5);
  operator<<(outs,&triangle->y);
  std::__ostream_insert<char,std::char_traits<char>>(outs," (",2);
  operator<<(outs,triangle->colorY);
  std::__ostream_insert<char,std::char_traits<char>>(outs,") z: ",5);
  operator<<(outs,&triangle->z);
  std::__ostream_insert<char,std::char_traits<char>>(outs," (",2);
  operator<<(outs,triangle->colorZ);
  std::__ostream_insert<char,std::char_traits<char>>(outs,")",1);
  return outs;
}

Assistant:

std::ostream& operator<<(std::ostream& outs, Triangle const& triangle)
{
  outs << "x: " << triangle.x << " (" << triangle.colorX << ") y: " << triangle.y << " ("
       << triangle.colorY << ") z: " << triangle.z << " (" << triangle.colorZ << ")";
  return outs;
}